

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O0

MessageLite * __thiscall
google::protobuf::internal::MessageCreator::PlacementNew<false,google::protobuf::MessageLite>
          (MessageCreator *this,MessageLite *prototype_for_func,MessageLite *prototype_for_copy,
          void *mem,Arena *arena)

{
  bool bVar1;
  int v1;
  int v2;
  type_conflict tVar2;
  char *pcVar3;
  LogMessage *pLVar4;
  uintptr_t uVar5;
  Arena **v1_00;
  void **v2_00;
  LogMessage local_158;
  Voidify local_141;
  void *local_140;
  Nullable<const_char_*> local_138;
  Nullable<const_char_*> absl_log_internal_check_op_result_3;
  Voidify local_119;
  unsigned_long local_118;
  unsigned_long local_110;
  Nullable<const_char_*> local_108;
  Nullable<const_char_*> absl_log_internal_check_op_result_2;
  size_t offset_2;
  uintptr_t offsets;
  long local_e8;
  size_t offset_1;
  Voidify local_c9;
  Nullable<const_char_*> local_c8;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  size_t offset;
  LogMessage local_b0;
  Voidify local_9a [2];
  void *local_98;
  char *src;
  size_t size;
  char *dst;
  undefined1 local_78 [6];
  bool kMustBeFunc;
  Tag as_tag;
  Voidify local_65;
  uint local_64;
  unsigned_long local_60;
  Nullable<const_char_*> local_58;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Arena *arena_local;
  void *mem_local;
  MessageLite *prototype_for_copy_local;
  MessageLite *prototype_for_func_local;
  MessageCreator *this_local;
  long local_20;
  Nullable<const_char_*> local_18;
  long local_10;
  
  absl_log_internal_check_op_result = (Nullable<const_char_*>)arena;
  arena_local = (Arena *)mem;
  mem_local = prototype_for_copy;
  prototype_for_copy_local = prototype_for_func;
  prototype_for_func_local = (MessageLite *)this;
  local_60 = absl::lts_20250127::log_internal::GetReferenceableValue
                       ((ulong)mem % (ulong)this->alignment_);
  local_64 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
  local_58 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_long,unsigned_int>
                       (&local_60,&local_64,"reinterpret_cast<uintptr_t>(mem) % alignment_ == 0u");
  if (local_58 != (Nullable<const_char_*>)0x0) {
    pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_58);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.h"
               ,0x4e3,pcVar3);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream((LogMessage *)local_78);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_65,pLVar4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_78)
    ;
  }
  dst._7_1_ = tag(this);
  dst._6_1_ = 0;
  if (dst._7_1_ < kZeroInit) {
    NoopDebugCounter::Inc((NoopDebugCounter *)((long)&dst + 5));
    this_local = (MessageCreator *)
                 (*(this->field_3).func_)
                           (prototype_for_copy_local,arena_local,
                            (Arena *)absl_log_internal_check_op_result);
  }
  else {
    size = (size_t)arena_local;
    src = (char *)(ulong)this->allocation_size_;
    local_98 = mem_local;
    if (dst._7_1_ == kZeroInit) {
      bVar1 = std::
              all_of<char_const*,google::protobuf::internal::MessageCreator::PlacementNew<false,google::protobuf::MessageLite>(google::protobuf::MessageLite_const*,google::protobuf::MessageLite_const*,void*,google::protobuf::Arena*)const::_lambda(auto:1)_1_>
                        ((long)mem_local + 0x10);
      offset._7_1_ = 0;
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.h"
                   ,0x4fb,
                   "std::all_of(src + sizeof(MessageLite), src + size, [](auto c) { return c == 0; })"
                  );
        offset._7_1_ = 1;
        pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_b0);
        absl::lts_20250127::log_internal::Voidify::operator&&(local_9a,pLVar4);
      }
      if ((offset._7_1_ & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_b0);
      }
      if (src < (char *)0x21) {
        memset(src + (size - 0x10),0,0x10);
      }
      else if (src < (char *)0x41) {
        memset((void *)(size + 0x10),0,0x10);
        memset(src + (size - 0x20),0,0x20);
      }
      else {
        for (absl_log_internal_check_op_result_1 = (Nullable<const_char_*>)0x10;
            absl_log_internal_check_op_result_1 + 0x40 < src;
            absl_log_internal_check_op_result_1 = absl_log_internal_check_op_result_1 + 0x40) {
          local_18 = absl_log_internal_check_op_result_1 + size + 0x40;
          memset(absl_log_internal_check_op_result_1 + size,0,0x40);
        }
        memset(src + (size - 0x40),0,0x40);
      }
    }
    else {
      v1 = absl::lts_20250127::log_internal::GetReferenceableValue((int)dst._7_1_);
      v2 = absl::lts_20250127::log_internal::GetReferenceableValue(1);
      local_c8 = absl::lts_20250127::log_internal::Check_EQImpl(v1,v2,"+as_tag == +kMemcpy");
      if (local_c8 != (Nullable<const_char_*>)0x0) {
        pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_c8);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&offset_1,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.h"
                   ,0x50c,pcVar3);
        pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                           ((LogMessage *)&offset_1);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_c9,pLVar4);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&offset_1);
      }
      local_c8 = (Nullable<const_char_*>)0x0;
      if (src < (char *)0x21) {
        *(undefined8 *)(src + (size - 0x10)) = *(undefined8 *)(src + (long)local_98 + -0x10);
        *(undefined8 *)(src + (size - 8)) = *(undefined8 *)(src + (long)local_98 + -8);
      }
      else if (src < (char *)0x41) {
        *(undefined8 *)(size + 0x10) = *(undefined8 *)((long)local_98 + 0x10);
        *(undefined8 *)(size + 0x18) = *(undefined8 *)((long)local_98 + 0x18);
        *(undefined8 *)(src + (size - 0x20)) = *(undefined8 *)(src + (long)local_98 + -0x20);
        *(undefined8 *)(src + (size - 0x18)) = *(undefined8 *)(src + (long)local_98 + -0x18);
        *(undefined8 *)(src + (size - 0x10)) = *(undefined8 *)(src + (long)local_98 + -0x10);
        *(undefined8 *)(src + (size - 8)) = *(undefined8 *)(src + (long)local_98 + -8);
      }
      else {
        for (local_e8 = 0x10; (char *)(local_e8 + 0x40U) < src; local_e8 = local_e8 + 0x40) {
          local_10 = (long)local_98 + local_e8 + 0x40;
          local_20 = size + local_e8 + 0x40;
          memcpy((void *)(size + local_e8),(void *)((long)local_98 + local_e8),0x40);
        }
        memcpy(src + (size - 0x40),(char *)((long)local_98 + (long)src) + -0x40,0x40);
      }
    }
    uVar5 = arena_bits(this);
    if (uVar5 == 0) {
      if (dst._7_1_ == kZeroInit) {
        NoopDebugCounter::Inc((NoopDebugCounter *)((long)&offsets + 5));
      }
      else {
        NoopDebugCounter::Inc((NoopDebugCounter *)((long)&offsets + 4));
      }
    }
    else if (dst._7_1_ == kZeroInit) {
      NoopDebugCounter::Inc((NoopDebugCounter *)((long)&offsets + 7));
    }
    else {
      NoopDebugCounter::Inc((NoopDebugCounter *)((long)&offsets + 6));
    }
    offset_2 = arena_bits(this);
    if (offset_2 != 0) {
      do {
        tVar2 = absl::lts_20250127::countr_zero<unsigned_long>(offset_2);
        absl_log_internal_check_op_result_2 = (Nullable<const_char_*>)((long)tVar2 * 8);
        local_110 = absl::lts_20250127::log_internal::GetReferenceableValue
                              ((unsigned_long)(absl_log_internal_check_op_result_2 + 8));
        local_118 = absl::lts_20250127::log_internal::GetReferenceableValue((unsigned_long)src);
        local_108 = absl::lts_20250127::log_internal::Check_LEImpl<unsigned_long,unsigned_long>
                              (&local_110,&local_118,"offset + sizeof(Arena*) <= size");
        if (local_108 != (Nullable<const_char_*>)0x0) {
          pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_108);
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&absl_log_internal_check_op_result_3,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.h"
                     ,0x531,pcVar3);
          pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                             ((LogMessage *)&absl_log_internal_check_op_result_3);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_119,pLVar4);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&absl_log_internal_check_op_result_3);
        }
        v1_00 = absl::lts_20250127::log_internal::GetReferenceableValue<google::protobuf::Arena*>
                          ((Arena **)(absl_log_internal_check_op_result_2 + size));
        local_140 = (void *)0x0;
        v2_00 = absl::lts_20250127::log_internal::GetReferenceableValue<decltype(nullptr)>
                          (&local_140);
        local_138 = absl::lts_20250127::log_internal::
                    Check_EQImpl<google::protobuf::Arena*,decltype(nullptr)>
                              (v1_00,v2_00,"*reinterpret_cast<Arena**>(dst + offset) == nullptr");
        if (local_138 != (Nullable<const_char_*>)0x0) {
          pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_138);
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_158,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.h"
                     ,0x534,pcVar3);
          pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_158);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_141,pLVar4);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_158);
        }
        *(Nullable<const_char_*> *)(absl_log_internal_check_op_result_2 + size) =
             absl_log_internal_check_op_result;
        offset_2 = offset_2 - 1 & offset_2;
        local_138 = (Nullable<const_char_*>)0x0;
      } while (offset_2 != 0);
      local_138 = (Nullable<const_char_*>)0x0;
      offset_2 = 0;
    }
    *(undefined8 *)size = *mem_local;
    *(undefined8 *)(size + 8) = *(undefined8 *)((long)mem_local + 8);
    *(Nullable<const_char_*> *)(size + 8) = absl_log_internal_check_op_result;
    this_local = (MessageCreator *)
                 Launder<google::protobuf::MessageLite>((MessageLite *)arena_local);
  }
  return (MessageLite *)this_local;
}

Assistant:

PROTOBUF_ALWAYS_INLINE MessageLite* MessageCreator::PlacementNew(
    const MessageLite* prototype_for_func,
    const MessageLite* prototype_for_copy, void* mem, Arena* arena) const {
  ABSL_DCHECK_EQ(reinterpret_cast<uintptr_t>(mem) % alignment_, 0u);
  const Tag as_tag = tag();
  // When the feature is not enabled we skip the `as_tag` check since it is
  // unnecessary. Except for testing, where we want to test the copy logic even
  // when we can't use it for real messages.
  constexpr bool kMustBeFunc = !test_call && !internal::EnableCustomNew();
  static_assert(kFunc < 0 && !(kZeroInit < 0) && !(kMemcpy < 0),
                "Only kFunc must be the only negative value");
  if (ABSL_PREDICT_FALSE(kMustBeFunc || (int8_t)as_tag < 0)) {
    PROTOBUF_DEBUG_COUNTER("MessageCreator.Func").Inc();
    return static_cast<MessageLite*>(func_(prototype_for_func, mem, arena));
  }

  char* dst = static_cast<char*>(mem);
  const size_t size = allocation_size_;
  const char* src = reinterpret_cast<const char*>(prototype_for_copy);

  // These are a bit more efficient than calling normal memset/memcpy because:
  //  - We know the minimum size is 16. We have a fallback for when it is not.
  //  - We can "underflow" the buffer because those are the MessageLite bytes
  //    we will set later.
  if (as_tag == kZeroInit) {
    // Make sure the input is really all zeros.
    ABSL_DCHECK(std::all_of(src + sizeof(MessageLite), src + size,
                            [](auto c) { return c == 0; }));

    if (sizeof(MessageLite) != 16) {
      memset(dst, 0, size);
    } else if (size <= 32) {
      memset(dst + size - 16, 0, 16);
    } else if (size <= 64) {
      memset(dst + 16, 0, 16);
      memset(dst + size - 32, 0, 32);
    } else {
      for (size_t offset = 16; offset + 64 < size; offset += 64) {
        absl::PrefetchToLocalCacheForWrite(dst + offset + 64);
        memset(dst + offset, 0, 64);
      }
      memset(dst + size - 64, 0, 64);
    }
  } else {
    ABSL_DCHECK_EQ(+as_tag, +kMemcpy);

    if (sizeof(MessageLite) != 16) {
      memcpy(dst, src, size);
    } else if (size <= 32) {
      memcpy(dst + size - 16, src + size - 16, 16);
    } else if (size <= 64) {
      memcpy(dst + 16, src + 16, 16);
      memcpy(dst + size - 32, src + size - 32, 32);
    } else {
      for (size_t offset = 16; offset + 64 < size; offset += 64) {
        absl::PrefetchToLocalCache(src + offset + 64);
        absl::PrefetchToLocalCacheForWrite(dst + offset + 64);
        memcpy(dst + offset, src + offset, 64);
      }
      memcpy(dst + size - 64, src + size - 64, 64);
    }
  }

  if (arena_bits() != 0) {
    if (as_tag == kZeroInit) {
      PROTOBUF_DEBUG_COUNTER("MessageCreator.ZeroArena").Inc();
    } else {
      PROTOBUF_DEBUG_COUNTER("MessageCreator.McpyArena").Inc();
    }
  } else {
    if (as_tag == kZeroInit) {
      PROTOBUF_DEBUG_COUNTER("MessageCreator.Zero").Inc();
    } else {
      PROTOBUF_DEBUG_COUNTER("MessageCreator.Mcpy").Inc();
    }
  }

  if (internal::PerformDebugChecks() || arena != nullptr) {
    if (uintptr_t offsets = arena_bits()) {
      do {
        const size_t offset = absl::countr_zero(offsets) * sizeof(Arena*);
        ABSL_DCHECK_LE(offset + sizeof(Arena*), size);
        // Verify we are overwriting a null pointer. If we are not, there is a
        // bug somewhere.
        ABSL_DCHECK_EQ(*reinterpret_cast<Arena**>(dst + offset), nullptr);
        memcpy(dst + offset, &arena, sizeof(arena));
        offsets &= offsets - 1;
      } while (offsets != 0);
    }
  }

  // The second memcpy overwrites part of the first, but the compiler should
  // avoid the double-write. It's easier than trying to avoid the overlap.
  memcpy(dst, static_cast<const void*>(prototype_for_copy),
         sizeof(MessageLite));
  memcpy(dst + PROTOBUF_FIELD_OFFSET(MessageLite, _internal_metadata_), &arena,
         sizeof(arena));
  return Launder(reinterpret_cast<MessageLite*>(mem));
}